

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.hpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLReader::movePlainContentChars(XMLReader *this,XMLBuffer *dest)

{
  bool bVar1;
  ulong local_30;
  XMLSize_t count;
  XMLCh *cursor;
  XMLSize_t chunkSize;
  XMLBuffer *dest_local;
  XMLReader *this_local;
  
  count = (XMLSize_t)(this->fCharBuf + this->fCharIndex);
  local_30 = 0;
  while( true ) {
    bVar1 = false;
    if (local_30 < this->fCharsAvail - this->fCharIndex) {
      bVar1 = (this->fgCharCharsTable[*(ushort *)count] & 8) != 0;
      count = count + 2;
    }
    if (!bVar1) break;
    local_30 = local_30 + 1;
  }
  if (local_30 != 0) {
    XMLBuffer::append(dest,this->fCharBuf + this->fCharIndex,local_30);
    this->fCharIndex = local_30 + this->fCharIndex;
    this->fCurCol = local_30 + this->fCurCol;
  }
  return;
}

Assistant:

inline void XMLReader::movePlainContentChars(XMLBuffer &dest)
{
    const XMLSize_t chunkSize = fCharsAvail - fCharIndex;
    const XMLCh* cursor = &fCharBuf[fCharIndex];
    XMLSize_t count=0;
    for(;count<chunkSize && (fgCharCharsTable[*cursor++] & gPlainContentCharMask) != 0;++count) /*noop*/ ;

    if (count!=0)
    {
        dest.append(&fCharBuf[fCharIndex], count);
        fCharIndex += count;
        fCurCol    += (XMLFileLoc)count;
    }
}